

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O3

void __thiscall Am_Priority_List::Delete(Am_Priority_List *this)

{
  Am_Priority_List_Item *this_00;
  Am_Priority_List_Item *pAVar1;
  Am_Priority_List_Item *pAVar2;
  Am_Priority_List_Item **ppAVar3;
  
  this_00 = this->current;
  if (this_00 != (Am_Priority_List_Item *)0x0) {
    pAVar1 = this_00->prev;
    this->current = pAVar1;
    ppAVar3 = &pAVar1->next;
    if (pAVar1 == (Am_Priority_List_Item *)0x0) {
      ppAVar3 = &this->head;
    }
    pAVar2 = this_00->next;
    *ppAVar3 = pAVar2;
    ppAVar3 = &pAVar2->prev;
    if (pAVar2 == (Am_Priority_List_Item *)0x0) {
      ppAVar3 = &this->tail;
    }
    *ppAVar3 = pAVar1;
    Am_Object::~Am_Object(&this_00->obj);
    operator_delete(this_00);
    return;
  }
  Am_Error("Call to Delete on priority list but no current item");
}

Assistant:

void
Am_Priority_List::Delete()
{
  if (current) {
    Am_Priority_List_Item *item = current;
    this->take_out_item(item); //will adjust current pointer
    delete item;
  } else
    Am_Error("Call to Delete on priority list but no current item");
}